

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# call_graph.hpp
# Opt level: O3

void __thiscall
HawkTracer::client::CallGraph::TreeNode::TreeNode(TreeNode *this,NodeData *node_data)

{
  HT_TimestampNs HVar1;
  
  (this->data).label._M_dataplus._M_p = (pointer)&(this->data).label.field_2;
  (this->data).label._M_string_length = 0;
  (this->data).label.field_2._M_local_buf[0] = '\0';
  (this->children).
  super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->children).
  super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->children).
  super__Vector_base<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>,_std::allocator<std::pair<std::shared_ptr<HawkTracer::client::CallGraph::TreeNode>,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parent).
  super___weak_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (this->parent).
  super___weak_ptr<HawkTracer::client::CallGraph::TreeNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  std::__cxx11::string::_M_assign((string *)this);
  HVar1 = node_data->stop_ts;
  (this->data).start_ts = node_data->start_ts;
  (this->data).stop_ts = HVar1;
  this->total_duration = node_data->stop_ts - node_data->start_ts;
  this->total_children_duration = 0;
  return;
}

Assistant:

TreeNode(NodeData node_data)
        {
            data = node_data;
            total_duration = node_data.get_duration();
            total_children_duration = 0u;
        }